

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O3

int m_uncomp_copy(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  byte *pbVar2;
  uint32_t *puVar3;
  uint uVar4;
  int iVar5;
  internal_state_conflict *state;
  size_t sVar6;
  ulong uVar7;
  
  piVar1 = strm->state;
  uVar4 = strm->bits_per_sample;
  iVar5 = piVar1->bitp;
  while( true ) {
    if (iVar5 < (int)uVar4) {
      sVar6 = strm->avail_in;
      do {
        sVar6 = sVar6 - 1;
        if (sVar6 == 0xffffffffffffffff) {
          return 0;
        }
        strm->avail_in = sVar6;
        uVar7 = piVar1->acc << 8;
        piVar1->acc = uVar7;
        pbVar2 = strm->next_in;
        strm->next_in = pbVar2 + 1;
        piVar1->acc = *pbVar2 | uVar7;
        iVar5 = iVar5 + 8;
        piVar1->bitp = iVar5;
      } while (iVar5 < (int)uVar4);
    }
    uVar7 = strm->avail_out;
    if (uVar7 < piVar1->bytes_per_sample) break;
    puVar3 = piVar1->rsip;
    piVar1->rsip = puVar3 + 1;
    *puVar3 = (uint)(piVar1->acc >> ((char)iVar5 - (char)uVar4 & 0x3fU)) &
              (uint)(0xffffffffffffffff >> (-(char)uVar4 & 0x3fU));
    strm->avail_out = uVar7 - piVar1->bytes_per_sample;
    uVar4 = strm->bits_per_sample;
    iVar5 = piVar1->bitp - uVar4;
    piVar1->bitp = iVar5;
    puVar3 = &piVar1->sample_counter;
    *puVar3 = *puVar3 - 1;
    if (*puVar3 == 0) {
      piVar1->mode = m_next_cds;
      return 1;
    }
  }
  return 0;
}

Assistant:

static int m_uncomp_copy(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;

    do {
        if (copysample(strm) == 0)
            return M_EXIT;
    } while(--state->sample_counter);

    state->mode = m_next_cds;
    return M_CONTINUE;
}